

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  ushort uVar1;
  ushort uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  size_t k;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar21;
  byte bVar22;
  int iVar23;
  byte bVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  long lVar30;
  byte bVar31;
  ulong *puVar32;
  NodeRef root;
  uint i_1;
  long lVar33;
  undefined4 uVar34;
  float *pfVar35;
  bool bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar69;
  float fVar70;
  vint4 ai_2;
  undefined1 auVar65 [16];
  float fVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar79;
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [12];
  float fVar89;
  vint4 ai;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar95;
  uint uVar99;
  uint uVar100;
  vint4 bi_2;
  undefined1 auVar96 [16];
  uint uVar101;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  vint4 ai_1;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vint4 ai_3;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> lower_z;
  vfloat<8> upper_x;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<8> upper_z;
  vfloat<8> upper_y;
  TravRayK<4,_false> tray;
  vfloat<8> lower_x;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  uint local_39ec;
  uint local_39d4;
  uint local_39d0;
  Precalculations local_39b1;
  undefined1 local_39b0 [8];
  float fStack_39a8;
  float fStack_39a4;
  undefined1 local_39a0 [8];
  float fStack_3998;
  float fStack_3994;
  uint local_3988;
  uint local_3984;
  RTCFilterFunctionNArguments local_3980;
  undefined1 local_3950 [16];
  undefined1 local_3940 [16];
  float local_3930;
  float fStack_392c;
  float fStack_3928;
  float fStack_3924;
  float local_3920;
  float fStack_391c;
  float fStack_3918;
  float fStack_3914;
  float local_3910;
  float fStack_390c;
  float fStack_3908;
  float fStack_3904;
  Geometry *local_3900;
  ulong local_38f8;
  undefined4 local_38f0;
  undefined4 local_38ec;
  RayK<4> *local_38e8;
  long local_38e0;
  long local_38d8;
  long local_38d0;
  ulong local_38c8;
  undefined1 local_38c0 [32];
  undefined1 local_3890 [16];
  undefined1 local_3880 [16];
  undefined1 local_3870 [16];
  undefined1 local_3860 [48];
  float local_3830;
  float fStack_382c;
  float fStack_3828;
  float fStack_3824;
  float local_3820;
  float fStack_381c;
  float fStack_3818;
  float fStack_3814;
  undefined1 local_3810 [8];
  float fStack_3808;
  float fStack_3804;
  undefined1 local_3800 [16];
  uint local_37f0;
  uint uStack_37ec;
  uint uStack_37e8;
  uint uStack_37e4;
  uint uStack_37e0;
  uint uStack_37dc;
  uint uStack_37d8;
  uint uStack_37d4;
  undefined1 local_37d0 [16];
  undefined1 local_37c0 [16];
  undefined1 local_37b0 [16];
  BVH *local_37a0;
  Intersectors *local_3798;
  long local_3790;
  long local_3788;
  undefined1 local_3780 [32];
  undefined1 local_3760 [16];
  undefined1 local_3750 [16];
  undefined1 local_3740 [32];
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3710;
  undefined1 local_36e0 [16];
  undefined1 local_36d0 [16];
  undefined1 local_36c0 [16];
  undefined1 local_36b0 [16];
  undefined1 local_36a0 [16];
  undefined1 local_3690 [16];
  float local_3680;
  float fStack_367c;
  float fStack_3678;
  float fStack_3674;
  undefined1 local_3670 [16];
  float local_3660;
  float fStack_365c;
  float fStack_3658;
  float fStack_3654;
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  undefined1 local_3630 [16];
  undefined1 local_3620 [16];
  undefined1 local_3610 [16];
  undefined1 local_3600 [32];
  undefined1 local_35e0 [16];
  undefined1 local_35d0 [16];
  undefined1 local_35c0 [16];
  undefined1 local_35b0 [16];
  undefined1 local_35a0 [16];
  undefined1 local_3590 [16];
  undefined1 local_3580 [16];
  undefined1 local_3570 [16];
  undefined1 local_3560 [16];
  undefined1 local_3550 [16];
  undefined1 local_3540 [16];
  undefined1 local_3530 [16];
  undefined1 local_3520 [16];
  undefined1 local_3510 [16];
  undefined8 local_3500;
  size_t local_34f8;
  ulong local_34f0 [560];
  undefined1 local_2370 [16];
  undefined1 local_2360 [16];
  undefined1 local_2350 [8992];
  
  local_34f8 = (((BVH *)This->ptr)->root).ptr;
  if (local_34f8 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar39 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar43 = ZEXT816(0) << 0x40;
      uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar43,5);
      uVar37 = vpcmpeqd_avx512vl(auVar39,(undefined1  [16])valid_i->field_0);
      uVar37 = ((byte)uVar9 & 0xf) & uVar37;
      bVar31 = (byte)uVar37;
      if (bVar31 != 0) {
        local_3710._0_4_ = *(float *)ray;
        local_3710._4_4_ = *(float *)(ray + 4);
        local_3710._8_4_ = *(float *)(ray + 8);
        local_3710._12_4_ = *(float *)(ray + 0xc);
        local_3710._16_4_ = *(float *)(ray + 0x10);
        local_3710._20_4_ = *(float *)(ray + 0x14);
        local_3710._24_4_ = *(float *)(ray + 0x18);
        local_3710._28_4_ = *(float *)(ray + 0x1c);
        local_3710._32_4_ = *(float *)(ray + 0x20);
        local_3710._36_4_ = *(float *)(ray + 0x24);
        local_3710._40_4_ = *(float *)(ray + 0x28);
        local_3710._44_4_ = *(float *)(ray + 0x2c);
        local_36e0 = *(undefined1 (*) [16])(ray + 0x40);
        local_36d0 = *(undefined1 (*) [16])(ray + 0x50);
        local_36c0 = *(undefined1 (*) [16])(ray + 0x60);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar123 = ZEXT1664(auVar39);
        local_38ec = (int)uVar37;
        auVar40 = vandps_avx512vl(local_36e0,auVar39);
        auVar42._8_4_ = 0x219392ef;
        auVar42._0_8_ = 0x219392ef219392ef;
        auVar42._12_4_ = 0x219392ef;
        uVar29 = vcmpps_avx512vl(auVar40,auVar42,1);
        bVar36 = (bool)((byte)uVar29 & 1);
        auVar40._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36e0._0_4_;
        bVar36 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36e0._4_4_;
        bVar36 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36e0._8_4_;
        bVar36 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36e0._12_4_;
        auVar41 = vandps_avx512vl(local_36d0,auVar39);
        uVar29 = vcmpps_avx512vl(auVar41,auVar42,1);
        bVar36 = (bool)((byte)uVar29 & 1);
        auVar41._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36d0._0_4_;
        bVar36 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36d0._4_4_;
        bVar36 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36d0._8_4_;
        bVar36 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36d0._12_4_;
        auVar39 = vandps_avx512vl(local_36c0,auVar39);
        uVar29 = vcmpps_avx512vl(auVar39,auVar42,1);
        bVar36 = (bool)((byte)uVar29 & 1);
        auVar60._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36c0._0_4_;
        bVar36 = (bool)((byte)(uVar29 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36c0._4_4_;
        bVar36 = (bool)((byte)(uVar29 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36c0._8_4_;
        bVar36 = (bool)((byte)(uVar29 >> 3) & 1);
        auVar60._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * local_36c0._12_4_;
        auVar42 = vrcp14ps_avx512vl(auVar40);
        auVar44._8_4_ = 0x3f800000;
        auVar44._0_8_ = 0x3f8000003f800000;
        auVar44._12_4_ = 0x3f800000;
        auVar39 = vfnmadd213ps_fma(auVar40,auVar42,auVar44);
        local_36b0 = vfmadd132ps_fma(auVar39,auVar42,auVar42);
        auVar40 = vrcp14ps_avx512vl(auVar41);
        auVar39 = vfnmadd213ps_fma(auVar41,auVar40,auVar44);
        local_36a0 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
        auVar40 = vrcp14ps_avx512vl(auVar60);
        auVar39 = vfnmadd213ps_fma(auVar60,auVar40,auVar44);
        local_3690 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
        uVar29 = vcmpps_avx512vl(local_36b0,auVar43,1);
        auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_3650._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar39._4_4_;
        local_3650._0_4_ = (uint)((byte)uVar29 & 1) * auVar39._0_4_;
        local_3650._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar39._8_4_;
        local_3650._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar39._12_4_;
        uVar29 = vcmpps_avx512vl(local_36a0,auVar43,5);
        auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar36 = (bool)((byte)uVar29 & 1);
        local_3640._0_4_ = (uint)bVar36 * auVar39._0_4_ | (uint)!bVar36 * 0x60;
        bVar36 = (bool)((byte)(uVar29 >> 1) & 1);
        local_3640._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * 0x60;
        bVar36 = (bool)((byte)(uVar29 >> 2) & 1);
        local_3640._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * 0x60;
        bVar36 = (bool)((byte)(uVar29 >> 3) & 1);
        local_3640._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * 0x60;
        local_3670._0_4_ = *(float *)(ray + 0x10) * local_36a0._0_4_;
        local_3670._4_4_ = *(float *)(ray + 0x14) * local_36a0._4_4_;
        local_3670._8_4_ = *(float *)(ray + 0x18) * local_36a0._8_4_;
        local_3670._12_4_ = *(float *)(ray + 0x1c) * local_36a0._12_4_;
        uVar29 = vcmpps_avx512vl(local_3690,auVar43,5);
        auVar39 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar36 = (bool)((byte)uVar29 & 1);
        local_3630._0_4_ = (uint)bVar36 * auVar39._0_4_ | (uint)!bVar36 * 0xa0;
        bVar36 = (bool)((byte)(uVar29 >> 1) & 1);
        local_3630._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * 0xa0;
        bVar36 = (bool)((byte)(uVar29 >> 2) & 1);
        local_3630._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * 0xa0;
        bVar36 = (bool)((byte)(uVar29 >> 3) & 1);
        local_3630._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * 0xa0;
        local_3680 = *(float *)ray * local_36b0._0_4_;
        fStack_367c = *(float *)(ray + 4) * local_36b0._4_4_;
        fStack_3678 = *(float *)(ray + 8) * local_36b0._8_4_;
        fStack_3674 = *(float *)(ray + 0xc) * local_36b0._12_4_;
        local_3660 = *(float *)(ray + 0x20) * local_3690._0_4_;
        fStack_365c = *(float *)(ray + 0x24) * local_3690._4_4_;
        fStack_3658 = *(float *)(ray + 0x28) * local_3690._8_4_;
        fStack_3654 = *(float *)(ray + 0x2c) * local_3690._12_4_;
        local_2370 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar125 = ZEXT1664(local_2370);
        auVar39 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar43);
        local_3620._0_4_ =
             (uint)(bVar31 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar31 & 1) * local_2370._0_4_;
        bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
        local_3620._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * local_2370._4_4_;
        bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
        local_3620._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * local_2370._8_4_;
        bVar36 = SUB81(uVar37 >> 3,0);
        local_3620._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * local_2370._12_4_;
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar124 = ZEXT1664(auVar39);
        auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar43);
        local_3610._0_4_ =
             (uint)(bVar31 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar31 & 1) * auVar39._0_4_;
        bVar36 = (bool)((byte)(uVar37 >> 1) & 1);
        local_3610._4_4_ = (uint)bVar36 * auVar43._4_4_ | (uint)!bVar36 * auVar39._4_4_;
        bVar36 = (bool)((byte)(uVar37 >> 2) & 1);
        local_3610._8_4_ = (uint)bVar36 * auVar43._8_4_ | (uint)!bVar36 * auVar39._8_4_;
        bVar36 = SUB81(uVar37 >> 3,0);
        local_3610._12_4_ = (uint)bVar36 * auVar43._12_4_ | (uint)!bVar36 * auVar39._12_4_;
        local_3798 = This;
        local_37a0 = (BVH *)This->ptr;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar29 = 3;
        }
        else {
          uVar29 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
        }
        local_38e8 = ray + 0x80;
        local_39ec = (ushort)uVar37 ^ 0xf;
        puVar32 = local_34f0;
        local_3500 = 0xfffffffffffffff8;
        pauVar28 = (undefined1 (*) [16])local_2350;
        local_2360 = local_3620;
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar126 = ZEXT1664(auVar39);
        auVar39 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar127 = ZEXT1664(auVar39);
        local_38f8 = uVar29;
LAB_01d87b20:
        do {
          auVar39 = auVar124._0_16_;
          do {
            root.ptr = puVar32[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01d88faf;
            puVar32 = puVar32 + -1;
            _local_39b0 = pauVar28[-1];
            auVar111 = ZEXT1664(_local_39b0);
            pauVar28 = pauVar28 + -1;
            uVar37 = vcmpps_avx512vl(_local_39b0,local_3610,1);
          } while ((char)uVar37 == '\0');
          uVar34 = (undefined4)uVar37;
          if (uVar29 < (uint)POPCOUNT(uVar34)) {
LAB_01d87b68:
            do {
              uVar37 = 8;
              auVar39 = auVar124._0_16_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01d88faf;
                uVar9 = vcmpps_avx512vl(auVar111._0_16_,local_3610,9);
                if ((char)uVar9 != '\0') {
                  local_3790 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar37 = root.ptr & 0xfffffffffffffff0;
                  bVar31 = ~(byte)local_39ec & 0xf;
                  lVar25 = 0;
                  while (auVar39 = auVar124._0_16_, lVar25 != local_3790) {
                    local_3788 = lVar25;
                    lVar25 = lVar25 * 0x90;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = *(ulong *)(uVar37 + 0x40 + lVar25);
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = *(ulong *)(uVar37 + 0x48 + lVar25);
                    uVar26 = vpcmpub_avx512vl(auVar39,auVar52,2);
                    if ((char)uVar26 != '\0') {
                      lVar25 = lVar25 + uVar37;
                      uVar26 = uVar26 & 0xff;
                      local_38d0 = lVar25;
                      do {
                        lVar11 = 0;
                        for (uVar38 = uVar26; (uVar38 & 1) == 0;
                            uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                          lVar11 = lVar11 + 1;
                        }
                        auVar53._8_8_ = 0;
                        auVar53._0_8_ = *(ulong *)(lVar25 + 0x40);
                        auVar68 = vpmovzxbd_avx2(auVar53);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        uVar34 = *(undefined4 *)(lVar25 + 0x7c);
                        auVar76._4_4_ = uVar34;
                        auVar76._0_4_ = uVar34;
                        auVar76._8_4_ = uVar34;
                        auVar76._12_4_ = uVar34;
                        auVar76._16_4_ = uVar34;
                        auVar76._20_4_ = uVar34;
                        auVar76._24_4_ = uVar34;
                        auVar76._28_4_ = uVar34;
                        uVar34 = *(undefined4 *)(lVar25 + 0x70);
                        auVar83._4_4_ = uVar34;
                        auVar83._0_4_ = uVar34;
                        auVar83._8_4_ = uVar34;
                        auVar83._12_4_ = uVar34;
                        auVar83._16_4_ = uVar34;
                        auVar83._20_4_ = uVar34;
                        auVar83._24_4_ = uVar34;
                        auVar83._28_4_ = uVar34;
                        auVar39 = vfmadd213ps_fma(auVar68,auVar76,auVar83);
                        local_3600 = ZEXT1632(auVar39);
                        auVar54._8_8_ = 0;
                        auVar54._0_8_ = *(ulong *)(lVar25 + 0x48);
                        auVar68 = vpmovzxbd_avx2(auVar54);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        auVar39 = vfmadd213ps_fma(auVar68,auVar76,auVar83);
                        local_3860._0_32_ = ZEXT1632(auVar39);
                        auVar55._8_8_ = 0;
                        auVar55._0_8_ = *(ulong *)(lVar25 + 0x50);
                        auVar68 = vpmovzxbd_avx2(auVar55);
                        uVar34 = *(undefined4 *)(lVar25 + 0x80);
                        auVar77._4_4_ = uVar34;
                        auVar77._0_4_ = uVar34;
                        auVar77._8_4_ = uVar34;
                        auVar77._12_4_ = uVar34;
                        auVar77._16_4_ = uVar34;
                        auVar77._20_4_ = uVar34;
                        auVar77._24_4_ = uVar34;
                        auVar77._28_4_ = uVar34;
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        uVar34 = *(undefined4 *)(lVar25 + 0x74);
                        auVar84._4_4_ = uVar34;
                        auVar84._0_4_ = uVar34;
                        auVar84._8_4_ = uVar34;
                        auVar84._12_4_ = uVar34;
                        auVar84._16_4_ = uVar34;
                        auVar84._20_4_ = uVar34;
                        auVar84._24_4_ = uVar34;
                        auVar84._28_4_ = uVar34;
                        auVar39 = vfmadd213ps_fma(auVar68,auVar77,auVar84);
                        auVar68 = ZEXT1632(auVar39);
                        local_3980.valid = (int *)auVar68._0_8_;
                        local_3980.geometryUserPtr = (void *)auVar68._8_8_;
                        local_3980.context = (RTCRayQueryContext *)auVar68._16_8_;
                        local_3980.ray = (RTCRayN *)auVar68._24_8_;
                        auVar56._8_8_ = 0;
                        auVar56._0_8_ = *(ulong *)(lVar25 + 0x58);
                        auVar68 = vpmovzxbd_avx2(auVar56);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        auVar39 = vfmadd213ps_fma(auVar68,auVar77,auVar84);
                        local_3740 = ZEXT1632(auVar39);
                        auVar57._8_8_ = 0;
                        auVar57._0_8_ = *(ulong *)(lVar25 + 0x60);
                        auVar68 = vpmovzxbd_avx2(auVar57);
                        uVar34 = *(undefined4 *)(lVar25 + 0x84);
                        auVar78._4_4_ = uVar34;
                        auVar78._0_4_ = uVar34;
                        auVar78._8_4_ = uVar34;
                        auVar78._12_4_ = uVar34;
                        auVar78._16_4_ = uVar34;
                        auVar78._20_4_ = uVar34;
                        auVar78._24_4_ = uVar34;
                        auVar78._28_4_ = uVar34;
                        uVar34 = *(undefined4 *)(lVar25 + 0x78);
                        auVar85._4_4_ = uVar34;
                        auVar85._0_4_ = uVar34;
                        auVar85._8_4_ = uVar34;
                        auVar85._12_4_ = uVar34;
                        auVar85._16_4_ = uVar34;
                        auVar85._20_4_ = uVar34;
                        auVar85._24_4_ = uVar34;
                        auVar85._28_4_ = uVar34;
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        auVar39 = vfmadd213ps_fma(auVar68,auVar78,auVar85);
                        local_38c0 = ZEXT1632(auVar39);
                        auVar58._8_8_ = 0;
                        auVar58._0_8_ = *(ulong *)(lVar25 + 0x68);
                        auVar68 = vpmovzxbd_avx2(auVar58);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        auVar39 = vfmadd213ps_fma(auVar68,auVar78,auVar85);
                        local_3780 = ZEXT1632(auVar39);
                        auVar122._4_4_ = fStack_367c;
                        auVar122._0_4_ = local_3680;
                        auVar122._8_4_ = fStack_3678;
                        auVar122._12_4_ = fStack_3674;
                        uVar38 = (ulong)(uint)((int)lVar11 * 4);
                        uVar34 = *(undefined4 *)(local_3600 + uVar38);
                        auVar90._4_4_ = uVar34;
                        auVar90._0_4_ = uVar34;
                        auVar90._8_4_ = uVar34;
                        auVar90._12_4_ = uVar34;
                        auVar40 = vfmsub132ps_fma(auVar90,auVar122,local_36b0);
                        uVar34 = *(undefined4 *)((long)&local_3980.valid + uVar38);
                        auVar102._4_4_ = uVar34;
                        auVar102._0_4_ = uVar34;
                        auVar102._8_4_ = uVar34;
                        auVar102._12_4_ = uVar34;
                        auVar20._4_4_ = fStack_365c;
                        auVar20._0_4_ = local_3660;
                        auVar20._8_4_ = fStack_3658;
                        auVar20._12_4_ = fStack_3654;
                        uVar34 = *(undefined4 *)(local_38c0 + uVar38);
                        auVar105._4_4_ = uVar34;
                        auVar105._0_4_ = uVar34;
                        auVar105._8_4_ = uVar34;
                        auVar105._12_4_ = uVar34;
                        auVar41 = vfmsub132ps_fma(auVar102,local_3670,local_36a0);
                        auVar60 = vfmsub132ps_fma(auVar105,auVar20,local_3690);
                        uVar34 = *(undefined4 *)(local_3860 + uVar38);
                        auVar61._4_4_ = uVar34;
                        auVar61._0_4_ = uVar34;
                        auVar61._8_4_ = uVar34;
                        auVar61._12_4_ = uVar34;
                        auVar42 = vfmsub132ps_avx512vl(local_36b0,auVar122,auVar61);
                        uVar34 = *(undefined4 *)(local_3740 + uVar38);
                        auVar8._4_4_ = uVar34;
                        auVar8._0_4_ = uVar34;
                        auVar8._8_4_ = uVar34;
                        auVar8._12_4_ = uVar34;
                        auVar44 = vfmsub132ps_avx512vl(local_36a0,local_3670,auVar8);
                        uVar34 = *(undefined4 *)(local_3780 + uVar38);
                        auVar62._4_4_ = uVar34;
                        auVar62._0_4_ = uVar34;
                        auVar62._8_4_ = uVar34;
                        auVar62._12_4_ = uVar34;
                        auVar45 = vfmsub132ps_avx512vl(local_3690,auVar20,auVar62);
                        auVar39 = vpminsd_avx(auVar40,auVar42);
                        auVar43 = vpminsd_avx(auVar41,auVar44);
                        auVar39 = vpmaxsd_avx(auVar39,auVar43);
                        auVar43 = vpminsd_avx(auVar60,auVar45);
                        auVar39 = vpmaxsd_avx(auVar39,auVar43);
                        auVar43 = vpmaxsd_avx(auVar40,auVar42);
                        auVar40 = vpmaxsd_avx(auVar41,auVar44);
                        auVar40 = vpminsd_avx(auVar43,auVar40);
                        auVar43 = vpmaxsd_avx(auVar60,auVar45);
                        auVar43 = vpminsd_avx(auVar40,auVar43);
                        auVar39 = vpmaxsd_avx(auVar39,local_3620);
                        auVar43 = vpminsd_avx(auVar43,local_3610);
                        uVar9 = vpcmpd_avx512vl(auVar39,auVar43,2);
                        if ((bVar31 & (byte)uVar9 & 0xf) == 0) {
                          bVar36 = false;
                        }
                        else {
                          local_38c8 = uVar26;
                          uVar1 = *(ushort *)(lVar25 + lVar11 * 8);
                          uVar2 = *(ushort *)(lVar25 + 2 + lVar11 * 8);
                          pGVar3 = (context->scene->geometries).items[*(uint *)(lVar25 + 0x88)].ptr;
                          local_38d8 = *(long *)&pGVar3->field_0x58;
                          local_38e0 = (ulong)*(uint *)(lVar25 + 4 + lVar11 * 8) *
                                       pGVar3[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i;
                          lVar11 = *(long *)&pGVar3[1].time_range.upper;
                          local_3984 = uVar1 & 0x7fff;
                          local_3988 = uVar2 & 0x7fff;
                          uVar95 = *(uint *)(local_38d8 + 4 + local_38e0);
                          uVar29 = (ulong)uVar95;
                          uVar38 = (ulong)(uVar95 * local_3988 +
                                          *(int *)(local_38d8 + local_38e0) + local_3984);
                          p_Var4 = pGVar3[1].intersectionFilterN;
                          local_3600._16_16_ =
                               *(undefined1 (*) [16])(lVar11 + (uVar38 + 1) * (long)p_Var4);
                          lVar25 = uVar38 + uVar29;
                          local_35d0 = *(undefined1 (*) [16])(lVar11 + lVar25 * (long)p_Var4);
                          lVar33 = uVar38 + uVar29 + 1;
                          local_35e0 = *(undefined1 (*) [16])(lVar11 + lVar33 * (long)p_Var4);
                          auVar39 = vpbroadcastd_avx512vl();
                          auVar111 = ZEXT1664(auVar39);
                          uVar26 = (ulong)(-1 < (short)uVar1);
                          lVar30 = uVar26 + lVar33;
                          local_35a0 = *(undefined1 (*) [16])(lVar11 + lVar30 * (long)p_Var4);
                          if ((short)uVar2 < 0) {
                            uVar29 = 0;
                          }
                          local_3560 = *(undefined1 (*) [16])
                                        (lVar11 + (lVar33 + uVar29) * (long)p_Var4);
                          local_3600._0_16_ = *(undefined1 (*) [16])(lVar11 + (long)p_Var4 * uVar38)
                          ;
                          local_35c0 = local_3600._16_16_;
                          local_35b0 = *(undefined1 (*) [16])
                                        (lVar11 + (uVar38 + uVar26 + 1) * (long)p_Var4);
                          local_3590 = local_35e0;
                          local_3580 = local_35d0;
                          local_3570 = local_35e0;
                          local_3550 = *(undefined1 (*) [16])
                                        (lVar11 + (lVar25 + uVar29) * (long)p_Var4);
                          local_3540 = local_35e0;
                          local_3530 = local_35a0;
                          local_3520 = *(undefined1 (*) [16])
                                        (lVar11 + (uVar29 + lVar30) * (long)p_Var4);
                          local_3510 = local_3560;
                          auVar39 = vpbroadcastd_avx512vl();
                          auVar128 = ZEXT1664(auVar39);
                          pfVar35 = (float *)(local_35d0 + 8);
                          uVar29 = 0;
                          bVar27 = bVar31;
                          do {
                            auVar39 = auVar127._0_16_;
                            if (uVar29 == 4) goto LAB_01d88e2d;
                            fVar63 = pfVar35[-0xe];
                            auVar72._4_4_ = fVar63;
                            auVar72._0_4_ = fVar63;
                            auVar72._8_4_ = fVar63;
                            auVar72._12_4_ = fVar63;
                            fVar69 = pfVar35[-0xd];
                            auVar96._4_4_ = fVar69;
                            auVar96._0_4_ = fVar69;
                            auVar96._8_4_ = fVar69;
                            auVar96._12_4_ = fVar69;
                            fVar70 = pfVar35[-0xc];
                            auVar108._4_4_ = fVar70;
                            auVar108._0_4_ = fVar70;
                            auVar108._8_4_ = fVar70;
                            auVar108._12_4_ = fVar70;
                            fVar71 = pfVar35[-10];
                            local_39b0._4_4_ = pfVar35[-9];
                            local_39a0._4_4_ = pfVar35[-8];
                            auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar35[-6]));
                            auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar35[-5]));
                            auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar35[-4]));
                            local_3930 = pfVar35[-2];
                            local_3910 = pfVar35[-1];
                            local_3920 = *pfVar35;
                            local_3750 = vmovdqa64_avx512vl(auVar128._0_16_);
                            local_3760 = vmovdqa64_avx512vl(auVar111._0_16_);
                            fVar107 = fVar63 - fVar71;
                            auVar112._4_4_ = fVar107;
                            auVar112._0_4_ = fVar107;
                            auVar112._8_4_ = fVar107;
                            auVar112._12_4_ = fVar107;
                            local_39b0._0_4_ = local_39b0._4_4_;
                            fStack_39a8 = (float)local_39b0._4_4_;
                            fStack_39a4 = (float)local_39b0._4_4_;
                            fVar89 = fVar69 - (float)local_39b0._4_4_;
                            auVar114._4_4_ = fVar89;
                            auVar114._0_4_ = fVar89;
                            auVar114._8_4_ = fVar89;
                            auVar114._12_4_ = fVar89;
                            local_39a0._0_4_ = local_39a0._4_4_;
                            fStack_3998 = (float)local_39a0._4_4_;
                            fStack_3994 = (float)local_39a0._4_4_;
                            fVar64 = fVar70 - (float)local_39a0._4_4_;
                            auVar117._4_4_ = fVar64;
                            auVar117._0_4_ = fVar64;
                            auVar117._8_4_ = fVar64;
                            auVar117._12_4_ = fVar64;
                            fStack_392c = local_3930;
                            fStack_3928 = local_3930;
                            fStack_3924 = local_3930;
                            auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(local_3930 - fVar63)));
                            fStack_390c = local_3910;
                            fStack_3908 = local_3910;
                            fStack_3904 = local_3910;
                            auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)(local_3910 - fVar69)));
                            fStack_391c = local_3920;
                            fStack_3918 = local_3920;
                            fStack_3914 = local_3920;
                            auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)(local_3920 - fVar70)));
                            fVar89 = fVar89 * (local_3920 - fVar70);
                            auVar103._4_4_ = fVar89;
                            auVar103._0_4_ = fVar89;
                            auVar103._8_4_ = fVar89;
                            auVar103._12_4_ = fVar89;
                            auVar53 = vfmsub231ps_avx512vl(auVar103,auVar51,auVar117);
                            fVar64 = fVar64 * (local_3930 - fVar63);
                            auVar104._4_4_ = fVar64;
                            auVar104._0_4_ = fVar64;
                            auVar104._8_4_ = fVar64;
                            auVar104._12_4_ = fVar64;
                            auVar54 = vfmsub231ps_avx512vl(auVar104,auVar52,auVar112);
                            fVar107 = (local_3910 - fVar69) * fVar107;
                            auVar106._4_4_ = fVar107;
                            auVar106._0_4_ = fVar107;
                            auVar106._8_4_ = fVar107;
                            auVar106._12_4_ = fVar107;
                            auVar43 = *(undefined1 (*) [16])ray;
                            auVar40 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar41 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar60 = *(undefined1 (*) [16])(ray + 0x40);
                            local_3860._32_16_ = vfmsub231ps_avx512vl(auVar106,auVar50,auVar114);
                            auVar45 = vsubps_avx(auVar72,auVar43);
                            auVar46 = vsubps_avx(auVar96,auVar40);
                            auVar59 = vsubps_avx(auVar108,auVar41);
                            auVar42 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar44 = *(undefined1 (*) [16])(ray + 0x60);
                            auVar55 = vmulps_avx512vl(auVar42,auVar59);
                            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar46,auVar44);
                            auVar56 = vmulps_avx512vl(auVar44,auVar45);
                            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar59,auVar60);
                            auVar57 = vmulps_avx512vl(auVar60,auVar46);
                            auVar57 = vfmsub231ps_avx512vl(auVar57,auVar45,auVar42);
                            auVar58 = vmulps_avx512vl(auVar52,auVar57);
                            auVar51 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar51);
                            auVar58 = vmulps_avx512vl(local_3860._32_16_,auVar44);
                            auVar58 = vfmadd231ps_avx512vl(auVar58,auVar54,auVar42);
                            auVar58 = vfmadd231ps_avx512vl(auVar58,auVar53,auVar60);
                            auVar50 = vfmadd231ps_avx512vl(auVar51,auVar55,auVar50);
                            auVar51 = vandps_avx512vl(auVar58,auVar126._0_16_);
                            auVar50 = vxorps_avx512vl(auVar51,auVar50);
                            uVar9 = vcmpps_avx512vl(auVar50,auVar39,5);
                            bVar22 = (byte)uVar9 & bVar27;
                            if (bVar22 != 0) {
                              auVar61 = vmulps_avx512vl(auVar117,auVar57);
                              auVar56 = vfmadd213ps_avx512vl(auVar56,auVar114,auVar61);
                              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar112,auVar56);
                              auVar61 = vxorps_avx512vl(auVar51,auVar55);
                              uVar9 = vcmpps_avx512vl(auVar61,auVar39,5);
                              bVar22 = bVar22 & (byte)uVar9;
                              if (bVar22 != 0) {
                                auVar122 = auVar123._0_16_;
                                auVar62 = vandps_avx512vl(auVar58,auVar122);
                                auVar8 = vsubps_avx(auVar62,auVar50);
                                uVar9 = vcmpps_avx512vl(auVar8,auVar61,5);
                                bVar22 = bVar22 & (byte)uVar9;
                                if (bVar22 != 0) {
                                  local_3890 = auVar49;
                                  local_3880 = auVar48;
                                  local_3870 = auVar47;
                                  local_3950 = vmovdqa64_avx512vl(auVar128._0_16_);
                                  local_3940 = vmovdqa64_avx512vl(auVar111._0_16_);
                                  auVar47 = vxorps_avx512vl(auVar55,auVar55);
                                  auVar119._0_4_ = local_3860._32_4_ * auVar59._0_4_;
                                  auVar119._4_4_ = local_3860._36_4_ * auVar59._4_4_;
                                  auVar119._8_4_ = local_3860._40_4_ * auVar59._8_4_;
                                  auVar119._12_4_ = local_3860._44_4_ * auVar59._12_4_;
                                  auVar46 = vfmadd213ps_fma(auVar46,auVar54,auVar119);
                                  auVar45 = vfmadd213ps_fma(auVar45,auVar53,auVar46);
                                  fVar63 = auVar62._0_4_;
                                  auVar115._0_4_ = fVar63 * *(float *)(ray + 0x30);
                                  fVar69 = auVar62._4_4_;
                                  auVar115._4_4_ = fVar69 * *(float *)(ray + 0x34);
                                  fVar70 = auVar62._8_4_;
                                  auVar115._8_4_ = fVar70 * *(float *)(ray + 0x38);
                                  fVar89 = auVar62._12_4_;
                                  auVar115._12_4_ = fVar89 * *(float *)(ray + 0x3c);
                                  auVar45 = vxorps_avx512vl(auVar51,auVar45);
                                  auVar120._0_4_ = fVar63 * *(float *)(ray + 0x80);
                                  auVar120._4_4_ = fVar69 * *(float *)(ray + 0x84);
                                  auVar120._8_4_ = fVar70 * *(float *)(ray + 0x88);
                                  auVar120._12_4_ = fVar89 * *(float *)(ray + 0x8c);
                                  uVar9 = vcmpps_avx512vl(auVar45,auVar120,2);
                                  uVar10 = vcmpps_avx512vl(auVar115,auVar45,1);
                                  bVar22 = bVar22 & (byte)uVar9 & (byte)uVar10;
                                  if (bVar22 == 0) {
LAB_01d886d4:
                                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar48 = vxorps_avx512vl(auVar39,auVar39);
                                    auVar47 = vmovdqa64_avx512vl(local_3940);
                                    auVar39 = vmovdqa64_avx512vl(local_3950);
                                  }
                                  else {
                                    uVar9 = vcmpps_avx512vl(auVar58,auVar47,4);
                                    bVar22 = bVar22 & (byte)uVar9;
                                    if (bVar22 == 0) goto LAB_01d886d4;
                                    local_37d0._0_8_ =
                                         CONCAT44(0,*(uint *)(local_3750 + uVar29 * 4));
                                    local_3900 = (context->scene->geometries).items
                                                 [CONCAT44(0,*(uint *)(local_3750 + uVar29 * 4))].
                                                 ptr;
                                    uVar95 = local_3900->mask;
                                    auVar116._4_4_ = uVar95;
                                    auVar116._0_4_ = uVar95;
                                    auVar116._8_4_ = uVar95;
                                    auVar116._12_4_ = uVar95;
                                    uVar9 = vptestmd_avx512vl(auVar116,*(undefined1 (*) [16])
                                                                        (ray + 0x90));
                                    bVar24 = (byte)uVar9 & 0xf & bVar22;
                                    local_39d4 = (uint)bVar24;
                                    if (bVar24 == 0) goto LAB_01d886d4;
                                    local_38f0 = *(undefined4 *)(local_3760 + uVar29 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (local_3900->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar43 = vcvtsi2ss_avx512f(auVar122,*(ushort *)
                                                                            (local_38d8 + 8 +
                                                                            local_38e0) - 1);
                                      auVar41 = ZEXT816(0) << 0x20;
                                      auVar88 = SUB1612(ZEXT816(0),0);
                                      auVar74._4_12_ = auVar88;
                                      auVar74._0_4_ = auVar43._0_4_;
                                      auVar40 = vrcp14ss_avx512f(auVar41,auVar74);
                                      auVar43 = vfnmadd213ss_fma(auVar43,auVar40,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar64 = auVar40._0_4_ * auVar43._0_4_;
                                      auVar43 = vcvtsi2ss_avx512f(auVar122,*(ushort *)
                                                                            (local_38d8 + 10 +
                                                                            local_38e0) - 1);
                                      auVar81._4_12_ = auVar88;
                                      auVar81._0_4_ = auVar43._0_4_;
                                      auVar40 = vrcp14ss_avx512f(auVar41,auVar81);
                                      auVar43 = vfnmadd213ss_fma(auVar43,auVar40,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar107 = auVar40._0_4_ * auVar43._0_4_;
                                      auVar43 = vcvtsi2ss_avx512f(auVar122,((uint)uVar29 & 1) +
                                                                           local_3984);
                                      fVar79 = auVar43._0_4_;
                                      auVar82._0_4_ = auVar50._0_4_ + fVar63 * fVar79;
                                      auVar82._4_4_ = auVar50._4_4_ + fVar69 * fVar79;
                                      auVar82._8_4_ = auVar50._8_4_ + fVar70 * fVar79;
                                      auVar82._12_4_ = auVar50._12_4_ + fVar89 * fVar79;
                                      auVar66._4_4_ = fVar64;
                                      auVar66._0_4_ = fVar64;
                                      auVar66._8_4_ = fVar64;
                                      auVar66._12_4_ = fVar64;
                                      auVar40 = vmulps_avx512vl(auVar82,auVar66);
                                      bVar36 = (bool)(bVar22 >> 1 & 1);
                                      bVar7 = (bool)(bVar22 >> 2 & 1);
                                      auVar43 = vcvtsi2ss_avx512f(auVar122,((uint)(uVar29 >> 1) &
                                                                           0x7fffffff) + local_3988)
                                      ;
                                      fVar64 = auVar43._0_4_;
                                      auVar67._0_4_ = auVar61._0_4_ + fVar63 * fVar64;
                                      auVar67._4_4_ = auVar61._4_4_ + fVar69 * fVar64;
                                      auVar67._8_4_ = auVar61._8_4_ + fVar70 * fVar64;
                                      auVar67._12_4_ = auVar61._12_4_ + fVar89 * fVar64;
                                      auVar75._4_4_ = fVar107;
                                      auVar75._0_4_ = fVar107;
                                      auVar75._8_4_ = fVar107;
                                      auVar75._12_4_ = fVar107;
                                      auVar41 = vmulps_avx512vl(auVar67,auVar75);
                                      bVar6 = (bool)(bVar22 >> 1 & 1);
                                      bVar5 = (bool)(bVar22 >> 2 & 1);
                                      auVar43 = vrcp14ps_avx512vl(auVar62);
                                      auVar13._8_4_ = 0x3f800000;
                                      auVar13._0_8_ = 0x3f8000003f800000;
                                      auVar13._12_4_ = 0x3f800000;
                                      auVar60 = vfnmadd213ps_avx512vl(auVar62,auVar43,auVar13);
                                      auVar43 = vfmadd132ps_fma(auVar60,auVar43,auVar43);
                                      fVar63 = auVar43._0_4_;
                                      fVar69 = auVar43._4_4_;
                                      fVar70 = auVar43._8_4_;
                                      fVar89 = auVar43._12_4_;
                                      local_3860._16_16_ = auVar54;
                                      local_3860._0_16_ = auVar53;
                                      fStack_382c = fVar69 * auVar45._4_4_;
                                      local_3830 = fVar63 * auVar45._0_4_;
                                      fStack_3824 = fVar89 * auVar45._12_4_;
                                      fStack_3828 = fVar70 * auVar45._8_4_;
                                      fStack_381c = (float)((uint)bVar6 * auVar41._4_4_ |
                                                           (uint)!bVar6 * (int)auVar61._4_4_) *
                                                    fVar69;
                                      local_3820 = (float)((uint)(bVar22 & 1) * auVar41._0_4_ |
                                                          (uint)!(bool)(bVar22 & 1) *
                                                          (int)auVar61._0_4_) * fVar63;
                                      fStack_3818 = (float)((uint)bVar5 * auVar41._8_4_ |
                                                           (uint)!bVar5 * (int)auVar61._8_4_) *
                                                    fVar70;
                                      fStack_3814 = (float)((uint)(bVar22 >> 3) * auVar41._12_4_ |
                                                           (uint)!(bool)(bVar22 >> 3) *
                                                           (int)auVar61._12_4_) * fVar89;
                                      local_3810._4_4_ =
                                           (float)((uint)bVar36 * auVar40._4_4_ |
                                                  (uint)!bVar36 * (int)auVar50._4_4_) * fVar69;
                                      local_3810._0_4_ =
                                           (float)((uint)(bVar22 & 1) * auVar40._0_4_ |
                                                  (uint)!(bool)(bVar22 & 1) * (int)auVar50._0_4_) *
                                           fVar63;
                                      fStack_3808 = (float)((uint)bVar7 * auVar40._8_4_ |
                                                           (uint)!bVar7 * (int)auVar50._8_4_) *
                                                    fVar70;
                                      fStack_3804 = (float)((uint)(bVar22 >> 3) * auVar40._12_4_ |
                                                           (uint)!(bool)(bVar22 >> 3) *
                                                           (int)auVar50._12_4_) * fVar89;
                                      local_3980.geometryUserPtr = local_37c0;
                                      local_3980.valid = (int *)local_3740;
                                      local_3980.context = (RTCRayQueryContext *)local_37b0;
                                      local_3980.ray = (RTCRayN *)local_3780;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                  *)&local_3980,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                  *)local_3860);
                                      local_3800 = vpbroadcastd_avx512vl();
                                      _local_3810 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                    vpbroadcastd_avx512vl();
                                      local_3860._0_32_ = local_3740;
                                      _local_3830 = local_3780._0_8_;
                                      _fStack_3828 = local_3780._8_8_;
                                      vpcmpeqd_avx2(ZEXT1632(local_3800),ZEXT1632(local_3800));
                                      uStack_37ec = context->user->instID[0];
                                      local_37f0 = uStack_37ec;
                                      uStack_37e8 = uStack_37ec;
                                      uStack_37e4 = uStack_37ec;
                                      uStack_37e0 = context->user->instPrimID[0];
                                      uStack_37dc = uStack_37e0;
                                      uStack_37d8 = uStack_37e0;
                                      uStack_37d4 = uStack_37e0;
                                      local_37d0 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar43 = vblendmps_avx512vl(local_37d0,local_37c0);
                                      bVar36 = (bool)(bVar24 >> 1 & 1);
                                      bVar6 = (bool)(bVar24 >> 2 & 1);
                                      *(uint *)(ray + 0x80) =
                                           (uint)(bVar24 & 1) * auVar43._0_4_ |
                                           (uint)!(bool)(bVar24 & 1) * local_37d0._0_4_;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar36 * auVar43._4_4_ |
                                           (uint)!bVar36 * local_37d0._4_4_;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar6 * auVar43._8_4_ |
                                           (uint)!bVar6 * local_37d0._8_4_;
                                      *(uint *)(ray + 0x8c) =
                                           (uint)(bVar24 >> 3) * auVar43._12_4_ |
                                           (uint)!(bool)(bVar24 >> 3) * local_37d0._12_4_;
                                      auVar43 = vpmovm2d_avx512vl((ulong)local_39d4);
                                      local_38c0._0_16_ = auVar43;
                                      local_3980.geometryUserPtr = local_3900->userPtr;
                                      local_3980.valid = (int *)local_38c0;
                                      local_3980.context = context->user;
                                      local_3980.ray = (RTCRayN *)ray;
                                      local_3980.hit = (RTCHitN *)local_3860;
                                      local_3980.N = 4;
                                      if (local_3900->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*local_3900->occlusionFilterN)(&local_3980);
                                        auVar43 = local_38c0._0_16_;
                                      }
                                      uVar26 = vptestmd_avx512vl(auVar43,auVar43);
                                      if ((uVar26 & 0xf) == 0) {
                                        local_39d4 = 0;
                                      }
                                      else {
                                        p_Var4 = context->args->filter;
                                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((local_3900->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var4)(&local_3980);
                                          auVar43 = local_38c0._0_16_;
                                        }
                                        uVar26 = vptestmd_avx512vl(auVar43,auVar43);
                                        uVar26 = uVar26 & 0xf;
                                        iVar23 = *(int *)(local_3980.ray + 0x84);
                                        iVar14 = *(int *)(local_3980.ray + 0x88);
                                        iVar15 = *(int *)(local_3980.ray + 0x8c);
                                        auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar36 = (bool)((byte)uVar26 & 1);
                                        bVar6 = (bool)((byte)(uVar26 >> 1) & 1);
                                        bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
                                        bVar5 = SUB81(uVar26 >> 3,0);
                                        local_39d4 = (uint)uVar26;
                                        *(uint *)&local_3980.ray[0x80].field_0x0 =
                                             (uint)bVar36 * auVar43._0_4_ |
                                             (uint)!bVar36 * *(int *)&local_3980.ray[0x80].field_0x0
                                        ;
                                        *(uint *)(local_3980.ray + 0x84) =
                                             (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * iVar23;
                                        *(uint *)(local_3980.ray + 0x88) =
                                             (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * iVar14;
                                        *(uint *)(local_3980.ray + 0x8c) =
                                             (uint)bVar5 * auVar43._12_4_ | (uint)!bVar5 * iVar15;
                                      }
                                      bVar36 = (bool)((byte)local_39d4 & 1);
                                      bVar6 = (bool)((byte)(local_39d4 >> 1) & 1);
                                      bVar7 = (bool)((byte)(local_39d4 >> 2) & 1);
                                      *(uint *)(ray + 0x80) =
                                           (uint)bVar36 * *(int *)(ray + 0x80) |
                                           (uint)!bVar36 * local_37d0._0_4_;
                                      *(uint *)(ray + 0x84) =
                                           (uint)bVar6 * *(int *)(ray + 0x84) |
                                           (uint)!bVar6 * local_37d0._4_4_;
                                      *(uint *)(ray + 0x88) =
                                           (uint)bVar7 * *(int *)(ray + 0x88) |
                                           (uint)!bVar7 * local_37d0._8_4_;
                                      *(uint *)(ray + 0x8c) =
                                           (local_39d4 >> 3) * *(int *)(ray + 0x8c) |
                                           (uint)!SUB41(local_39d4 >> 3,0) * local_37d0._12_4_;
                                      auVar43 = *(undefined1 (*) [16])ray;
                                      auVar40 = *(undefined1 (*) [16])(ray + 0x10);
                                      auVar41 = *(undefined1 (*) [16])(ray + 0x20);
                                      auVar60 = *(undefined1 (*) [16])(ray + 0x40);
                                      auVar42 = *(undefined1 (*) [16])(ray + 0x50);
                                      auVar44 = *(undefined1 (*) [16])(ray + 0x60);
                                    }
                                    bVar27 = ((byte)local_39d4 ^ 0xf) & bVar27;
                                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar59 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar48 = vxorps_avx512vl(auVar39,auVar39);
                                    auVar47 = vmovdqa64_avx512vl(local_3940);
                                    auVar39 = vmovdqa64_avx512vl(local_3950);
                                  }
                                  auVar128 = ZEXT1664(auVar39);
                                  auVar111 = ZEXT1664(auVar47);
                                  auVar127 = ZEXT1664(auVar48);
                                  auVar126 = ZEXT1664(auVar49);
                                  auVar125 = ZEXT1664(auVar45);
                                  auVar124 = ZEXT1664(auVar59);
                                  auVar123 = ZEXT1664(auVar46);
                                  auVar47 = local_3870;
                                  auVar48 = local_3880;
                                  auVar49 = local_3890;
                                }
                              }
                            }
                            auVar16._4_4_ = fVar71;
                            auVar16._0_4_ = fVar71;
                            auVar16._8_4_ = fVar71;
                            auVar16._12_4_ = fVar71;
                            auVar17._4_4_ = fStack_392c;
                            auVar17._0_4_ = local_3930;
                            auVar17._8_4_ = fStack_3928;
                            auVar17._12_4_ = fStack_3924;
                            auVar19._4_4_ = fStack_390c;
                            auVar19._0_4_ = local_3910;
                            auVar19._8_4_ = fStack_3908;
                            auVar19._12_4_ = fStack_3904;
                            auVar18._4_4_ = fStack_391c;
                            auVar18._0_4_ = local_3920;
                            auVar18._8_4_ = fStack_3918;
                            auVar18._12_4_ = fStack_3914;
                            auVar45 = vsubps_avx512vl(auVar47,auVar17);
                            auVar46 = vsubps_avx512vl(auVar48,auVar19);
                            auVar59 = vsubps_avx512vl(auVar49,auVar18);
                            auVar50 = vsubps_avx512vl(auVar16,auVar47);
                            auVar51 = vsubps_avx512vl(_local_39b0,auVar48);
                            auVar53 = vsubps_avx512vl(_local_39a0,auVar49);
                            auVar39 = vmulps_avx512vl(auVar46,auVar53);
                            auVar54 = vfmsub231ps_avx512vl(auVar39,auVar51,auVar59);
                            auVar39 = vmulps_avx512vl(auVar59,auVar50);
                            auVar55 = vfmsub231ps_avx512vl(auVar39,auVar53,auVar45);
                            auVar39 = vmulps_avx512vl(auVar45,auVar51);
                            local_3860._32_16_ = vfmsub231ps_avx512vl(auVar39,auVar50,auVar46);
                            auVar47 = vsubps_avx512vl(auVar47,auVar43);
                            auVar48 = vsubps_avx512vl(auVar48,auVar40);
                            auVar49 = vsubps_avx512vl(auVar49,auVar41);
                            auVar86._0_4_ = auVar49._0_4_ * auVar42._0_4_;
                            auVar86._4_4_ = auVar49._4_4_ * auVar42._4_4_;
                            auVar86._8_4_ = auVar49._8_4_ * auVar42._8_4_;
                            auVar86._12_4_ = auVar49._12_4_ * auVar42._12_4_;
                            auVar43 = vfmsub231ps_fma(auVar86,auVar48,auVar44);
                            auVar118._0_4_ = auVar44._0_4_ * auVar47._0_4_;
                            auVar118._4_4_ = auVar44._4_4_ * auVar47._4_4_;
                            auVar118._8_4_ = auVar44._8_4_ * auVar47._8_4_;
                            auVar118._12_4_ = auVar44._12_4_ * auVar47._12_4_;
                            auVar40 = vfmsub231ps_fma(auVar118,auVar49,auVar60);
                            auVar121._0_4_ = auVar48._0_4_ * auVar60._0_4_;
                            auVar121._4_4_ = auVar48._4_4_ * auVar60._4_4_;
                            auVar121._8_4_ = auVar48._8_4_ * auVar60._8_4_;
                            auVar121._12_4_ = auVar48._12_4_ * auVar60._12_4_;
                            auVar41 = vfmsub231ps_fma(auVar121,auVar47,auVar42);
                            auVar91._0_4_ = local_3860._32_4_ * auVar44._0_4_;
                            auVar91._4_4_ = local_3860._36_4_ * auVar44._4_4_;
                            auVar91._8_4_ = local_3860._40_4_ * auVar44._8_4_;
                            auVar91._12_4_ = local_3860._44_4_ * auVar44._12_4_;
                            auVar39 = vfmadd231ps_fma(auVar91,auVar55,auVar42);
                            auVar39 = vfmadd231ps_fma(auVar39,auVar54,auVar60);
                            auVar60 = vandps_avx512vl(auVar39,auVar126._0_16_);
                            auVar42 = vmulps_avx512vl(auVar53,auVar41);
                            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar51);
                            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar43,auVar50);
                            uVar95 = auVar60._0_4_;
                            auVar73._0_4_ = uVar95 ^ auVar42._0_4_;
                            uVar99 = auVar60._4_4_;
                            auVar73._4_4_ = uVar99 ^ auVar42._4_4_;
                            uVar100 = auVar60._8_4_;
                            auVar73._8_4_ = uVar100 ^ auVar42._8_4_;
                            uVar101 = auVar60._12_4_;
                            auVar73._12_4_ = uVar101 ^ auVar42._12_4_;
                            auVar60 = auVar127._0_16_;
                            uVar9 = vcmpps_avx512vl(auVar73,auVar60,5);
                            bVar22 = (byte)uVar9 & bVar27;
                            if (bVar22 != 0) {
                              auVar65._0_4_ = auVar59._0_4_ * auVar41._0_4_;
                              auVar65._4_4_ = auVar59._4_4_ * auVar41._4_4_;
                              auVar65._8_4_ = auVar59._8_4_ * auVar41._8_4_;
                              auVar65._12_4_ = auVar59._12_4_ * auVar41._12_4_;
                              auVar40 = vfmadd213ps_fma(auVar40,auVar46,auVar65);
                              auVar43 = vfmadd213ps_fma(auVar43,auVar45,auVar40);
                              auVar87._0_4_ = uVar95 ^ auVar43._0_4_;
                              auVar87._4_4_ = uVar99 ^ auVar43._4_4_;
                              auVar87._8_4_ = uVar100 ^ auVar43._8_4_;
                              auVar87._12_4_ = uVar101 ^ auVar43._12_4_;
                              uVar9 = vcmpps_avx512vl(auVar87,auVar60,5);
                              bVar22 = bVar22 & (byte)uVar9;
                              if (bVar22 != 0) {
                                auVar40 = vandps_avx512vl(auVar39,auVar123._0_16_);
                                auVar43 = vsubps_avx(auVar40,auVar73);
                                uVar9 = vcmpps_avx512vl(auVar43,auVar87,5);
                                bVar22 = bVar22 & (byte)uVar9;
                                if (bVar22 != 0) {
                                  local_3950 = vmovdqa64_avx512vl(auVar128._0_16_);
                                  local_3940 = vmovdqa64_avx512vl(auVar111._0_16_);
                                  auVar113._0_4_ = local_3860._32_4_ * auVar49._0_4_;
                                  auVar113._4_4_ = local_3860._36_4_ * auVar49._4_4_;
                                  auVar113._8_4_ = local_3860._40_4_ * auVar49._8_4_;
                                  auVar113._12_4_ = local_3860._44_4_ * auVar49._12_4_;
                                  auVar41 = vfmadd213ps_fma(auVar48,auVar55,auVar113);
                                  auVar41 = vfmadd213ps_fma(auVar47,auVar54,auVar41);
                                  fVar63 = auVar40._0_4_;
                                  auVar109._0_4_ = fVar63 * *(float *)(ray + 0x30);
                                  fVar69 = auVar40._4_4_;
                                  auVar109._4_4_ = fVar69 * *(float *)(ray + 0x34);
                                  fVar70 = auVar40._8_4_;
                                  auVar109._8_4_ = fVar70 * *(float *)(ray + 0x38);
                                  fVar71 = auVar40._12_4_;
                                  auVar109._12_4_ = fVar71 * *(float *)(ray + 0x3c);
                                  auVar80._0_4_ = (float)(uVar95 ^ auVar41._0_4_);
                                  auVar80._4_4_ = (float)(uVar99 ^ auVar41._4_4_);
                                  auVar80._8_4_ = (float)(uVar100 ^ auVar41._8_4_);
                                  auVar80._12_4_ = (float)(uVar101 ^ auVar41._12_4_);
                                  auVar97._0_4_ = fVar63 * *(float *)(ray + 0x80);
                                  auVar97._4_4_ = fVar69 * *(float *)(ray + 0x84);
                                  auVar97._8_4_ = fVar70 * *(float *)(ray + 0x88);
                                  auVar97._12_4_ = fVar71 * *(float *)(ray + 0x8c);
                                  uVar9 = vcmpps_avx512vl(auVar80,auVar97,2);
                                  uVar10 = vcmpps_avx512vl(auVar109,auVar80,1);
                                  bVar22 = bVar22 & (byte)uVar9 & (byte)uVar10;
                                  if (bVar22 != 0) {
                                    uVar9 = vcmpps_avx512vl(auVar39,ZEXT816(0) << 0x20,4);
                                    bVar22 = bVar22 & (byte)uVar9;
                                    if (bVar22 != 0) {
                                      local_39a0 = (undefined1  [8])
                                                   CONCAT44(0,*(uint *)(local_3750 + uVar29 * 4));
                                      pGVar3 = (context->scene->geometries).items
                                               [CONCAT44(0,*(uint *)(local_3750 + uVar29 * 4))].ptr;
                                      local_39b0 = (undefined1  [8])pGVar3;
                                      uVar95 = pGVar3->mask;
                                      auVar92._4_4_ = uVar95;
                                      auVar92._0_4_ = uVar95;
                                      auVar92._8_4_ = uVar95;
                                      auVar92._12_4_ = uVar95;
                                      uVar9 = vptestmd_avx512vl(auVar92,*(undefined1 (*) [16])
                                                                         (ray + 0x90));
                                      bVar24 = (byte)uVar9 & 0xf & bVar22;
                                      local_39d0 = (uint)bVar24;
                                      if (bVar24 != 0) {
                                        local_3930 = *(float *)(local_3760 + uVar29 * 4);
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar39 = vsubps_avx(auVar40,auVar87);
                                          auVar41 = vcvtsi2ss_avx512f(auVar52,*(ushort *)
                                                                               (local_38d8 + 8 +
                                                                               local_38e0) - 1);
                                          auVar42 = vrcp14ss_avx512f(ZEXT416(0) << 0x20,
                                                                     ZEXT416(auVar41._0_4_));
                                          auVar41 = vfnmadd213ss_fma(auVar41,auVar42,
                                                                     SUB6416(ZEXT464(0x40000000),0))
                                          ;
                                          fVar89 = auVar42._0_4_ * auVar41._0_4_;
                                          auVar41 = vcvtsi2ss_avx512f(auVar52,*(ushort *)
                                                                               (local_38d8 + 10 +
                                                                               local_38e0) - 1);
                                          auVar42 = vrcp14ss_avx512f(ZEXT416(0) << 0x20,
                                                                     ZEXT416(auVar41._0_4_));
                                          auVar41 = vfnmadd213ss_fma(auVar41,auVar42,
                                                                     SUB6416(ZEXT464(0x40000000),0))
                                          ;
                                          fVar64 = auVar42._0_4_ * auVar41._0_4_;
                                          auVar41 = vcvtsi2ss_avx512f(auVar57,((uint)uVar29 & 1) +
                                                                              local_3984);
                                          fVar107 = auVar41._0_4_;
                                          auVar110._0_4_ = fVar107 * fVar63 + auVar43._0_4_;
                                          auVar110._4_4_ = fVar107 * fVar69 + auVar43._4_4_;
                                          auVar110._8_4_ = fVar107 * fVar70 + auVar43._8_4_;
                                          auVar110._12_4_ = fVar107 * fVar71 + auVar43._12_4_;
                                          auVar93._4_4_ = fVar89;
                                          auVar93._0_4_ = fVar89;
                                          auVar93._8_4_ = fVar89;
                                          auVar93._12_4_ = fVar89;
                                          auVar42 = vmulps_avx512vl(auVar110,auVar93);
                                          bVar36 = (bool)(bVar22 >> 1 & 1);
                                          bVar7 = (bool)(bVar22 >> 2 & 1);
                                          auVar41 = vcvtsi2ss_avx512f(auVar56,((uint)(uVar29 >> 1) &
                                                                              0x7fffffff) +
                                                                              local_3988);
                                          fVar89 = auVar41._0_4_;
                                          auVar94._0_4_ = auVar39._0_4_ + fVar89 * fVar63;
                                          auVar94._4_4_ = auVar39._4_4_ + fVar89 * fVar69;
                                          auVar94._8_4_ = auVar39._8_4_ + fVar89 * fVar70;
                                          auVar94._12_4_ = auVar39._12_4_ + fVar89 * fVar71;
                                          auVar98._4_4_ = fVar64;
                                          auVar98._0_4_ = fVar64;
                                          auVar98._8_4_ = fVar64;
                                          auVar98._12_4_ = fVar64;
                                          auVar41 = vmulps_avx512vl(auVar94,auVar98);
                                          bVar6 = (bool)(bVar22 >> 1 & 1);
                                          bVar5 = (bool)(bVar22 >> 2 & 1);
                                          auVar44 = vrcp14ps_avx512vl(auVar40);
                                          auVar12._8_4_ = 0x3f800000;
                                          auVar12._0_8_ = 0x3f8000003f800000;
                                          auVar12._12_4_ = 0x3f800000;
                                          auVar40 = vfnmadd213ps_avx512vl(auVar40,auVar44,auVar12);
                                          auVar40 = vfmadd132ps_fma(auVar40,auVar44,auVar44);
                                          fVar63 = auVar40._0_4_;
                                          fVar69 = auVar40._4_4_;
                                          fVar70 = auVar40._8_4_;
                                          fVar71 = auVar40._12_4_;
                                          local_3860._16_16_ = auVar55;
                                          local_3860._0_16_ = auVar54;
                                          fStack_382c = fVar69 * auVar80._4_4_;
                                          local_3830 = fVar63 * auVar80._0_4_;
                                          fStack_3824 = fVar71 * auVar80._12_4_;
                                          fStack_3828 = fVar70 * auVar80._8_4_;
                                          fStack_381c = (float)((uint)bVar6 * auVar41._4_4_ |
                                                               (uint)!bVar6 * (int)auVar39._4_4_) *
                                                        fVar69;
                                          local_3820 = (float)((uint)(bVar22 & 1) * auVar41._0_4_ |
                                                              (uint)!(bool)(bVar22 & 1) *
                                                              (int)auVar39._0_4_) * fVar63;
                                          fStack_3818 = (float)((uint)bVar5 * auVar41._8_4_ |
                                                               (uint)!bVar5 * (int)auVar39._8_4_) *
                                                        fVar70;
                                          fStack_3814 = (float)((uint)(bVar22 >> 3) * auVar41._12_4_
                                                               | (uint)!(bool)(bVar22 >> 3) *
                                                                 (int)auVar39._12_4_) * fVar71;
                                          local_3810._4_4_ =
                                               (float)((uint)bVar36 * auVar42._4_4_ |
                                                      (uint)!bVar36 * (int)auVar43._4_4_) * fVar69;
                                          local_3810._0_4_ =
                                               (float)((uint)(bVar22 & 1) * auVar42._0_4_ |
                                                      (uint)!(bool)(bVar22 & 1) * (int)auVar43._0_4_
                                                      ) * fVar63;
                                          fStack_3808 = (float)((uint)bVar7 * auVar42._8_4_ |
                                                               (uint)!bVar7 * (int)auVar43._8_4_) *
                                                        fVar70;
                                          fStack_3804 = (float)((uint)(bVar22 >> 3) * auVar42._12_4_
                                                               | (uint)!(bool)(bVar22 >> 3) *
                                                                 (int)auVar43._12_4_) * fVar71;
                                          local_3980.geometryUserPtr = local_37c0;
                                          local_3980.valid = (int *)local_3740;
                                          local_3980.context = (RTCRayQueryContext *)local_37b0;
                                          local_3980.ray = (RTCRayN *)local_3780;
                                          std::
                                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                                          ::
                                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                                    ((
                                                  _Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                                  *)&local_3980,
                                                  (
                                                  _Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                                  *)local_3860);
                                          local_3800 = vpbroadcastd_avx512vl();
                                          _local_3810 = (
                                                  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                                  vpbroadcastd_avx512vl();
                                          local_3860._0_32_ = local_3740;
                                          _local_3830 = local_3780._0_8_;
                                          _fStack_3828 = local_3780._8_8_;
                                          vpcmpeqd_avx2(ZEXT1632(local_3800),ZEXT1632(local_3800));
                                          uStack_37ec = context->user->instID[0];
                                          local_37f0 = uStack_37ec;
                                          uStack_37e8 = uStack_37ec;
                                          uStack_37e4 = uStack_37ec;
                                          uStack_37e0 = context->user->instPrimID[0];
                                          uStack_37dc = uStack_37e0;
                                          uStack_37d8 = uStack_37e0;
                                          uStack_37d4 = uStack_37e0;
                                          _local_39a0 = *(undefined1 (*) [16])(ray + 0x80);
                                          auVar39 = vblendmps_avx512vl(_local_39a0,local_37c0);
                                          bVar36 = (bool)(bVar24 >> 1 & 1);
                                          bVar6 = (bool)(bVar24 >> 2 & 1);
                                          *(uint *)(ray + 0x80) =
                                               (uint)(bVar24 & 1) * auVar39._0_4_ |
                                               (uint)!(bool)(bVar24 & 1) * local_39a0._0_4_;
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar36 * auVar39._4_4_ |
                                               (uint)!bVar36 * local_39a0._4_4_;
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar6 * auVar39._8_4_ |
                                               (uint)!bVar6 * local_39a0._8_4_;
                                          *(uint *)(ray + 0x8c) =
                                               (uint)(bVar24 >> 3) * auVar39._12_4_ |
                                               (uint)!(bool)(bVar24 >> 3) * local_39a0._12_4_;
                                          auVar39 = vpmovm2d_avx512vl((ulong)local_39d0);
                                          local_38c0._0_16_ = auVar39;
                                          local_3980.geometryUserPtr =
                                               (void *)*(undefined8 *)((long)local_39b0 + 0x18);
                                          local_3980.valid = (int *)local_38c0;
                                          local_3980.context = context->user;
                                          local_3980.ray = (RTCRayN *)ray;
                                          local_3980.hit = (RTCHitN *)local_3860;
                                          local_3980.N = 4;
                                          if (*(code **)((long)local_39b0 + 0x48) != (code *)0x0) {
                                            (**(code **)((long)local_39b0 + 0x48))(&local_3980);
                                            auVar39 = local_38c0._0_16_;
                                          }
                                          uVar26 = vptestmd_avx512vl(auVar39,auVar39);
                                          if ((uVar26 & 0xf) == 0) {
                                            local_39d0 = 0;
                                          }
                                          else {
                                            p_Var4 = context->args->filter;
                                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                ((*(byte *)((long)local_39b0 + 0x3e) & 0x40) != 0)))
                                               ) {
                                              (*p_Var4)(&local_3980);
                                              auVar39 = local_38c0._0_16_;
                                            }
                                            uVar26 = vptestmd_avx512vl(auVar39,auVar39);
                                            uVar26 = uVar26 & 0xf;
                                            iVar23 = *(int *)(local_3980.ray + 0x84);
                                            iVar14 = *(int *)(local_3980.ray + 0x88);
                                            iVar15 = *(int *)(local_3980.ray + 0x8c);
                                            auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar36 = (bool)((byte)uVar26 & 1);
                                            bVar6 = (bool)((byte)(uVar26 >> 1) & 1);
                                            bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
                                            bVar5 = SUB81(uVar26 >> 3,0);
                                            local_39d0 = (uint)uVar26;
                                            *(uint *)&local_3980.ray[0x80].field_0x0 =
                                                 (uint)bVar36 * auVar39._0_4_ |
                                                 (uint)!bVar36 *
                                                 *(int *)&local_3980.ray[0x80].field_0x0;
                                            *(uint *)(local_3980.ray + 0x84) =
                                                 (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * iVar23
                                            ;
                                            *(uint *)(local_3980.ray + 0x88) =
                                                 (uint)bVar7 * auVar39._8_4_ | (uint)!bVar7 * iVar14
                                            ;
                                            *(uint *)(local_3980.ray + 0x8c) =
                                                 (uint)bVar5 * auVar39._12_4_ |
                                                 (uint)!bVar5 * iVar15;
                                          }
                                          bVar36 = (bool)((byte)local_39d0 & 1);
                                          bVar6 = (bool)((byte)(local_39d0 >> 1) & 1);
                                          bVar7 = (bool)((byte)(local_39d0 >> 2) & 1);
                                          *(uint *)local_38e8 =
                                               (uint)bVar36 * *(int *)local_38e8 |
                                               (uint)!bVar36 * local_39a0._0_4_;
                                          *(uint *)(local_38e8 + 4) =
                                               (uint)bVar6 * *(int *)(local_38e8 + 4) |
                                               (uint)!bVar6 * local_39a0._4_4_;
                                          *(uint *)(local_38e8 + 8) =
                                               (uint)bVar7 * *(int *)(local_38e8 + 8) |
                                               (uint)!bVar7 * (int)fStack_3998;
                                          *(uint *)(local_38e8 + 0xc) =
                                               (local_39d0 >> 3) * *(int *)(local_38e8 + 0xc) |
                                               (uint)!SUB41(local_39d0 >> 3,0) * (int)fStack_3994;
                                        }
                                        bVar27 = ((byte)local_39d0 ^ 0xf) & bVar27;
                                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar123 = ZEXT1664(auVar39);
                                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        auVar124 = ZEXT1664(auVar39);
                                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar125 = ZEXT1664(auVar39);
                                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar126 = ZEXT1664(auVar39);
                                        auVar39 = vxorps_avx512vl(auVar60,auVar60);
                                        auVar127 = ZEXT1664(auVar39);
                                        auVar39 = vmovdqa64_avx512vl(local_3940);
                                        auVar111 = ZEXT1664(auVar39);
                                        auVar39 = vmovdqa64_avx512vl(local_3950);
                                        auVar128 = ZEXT1664(auVar39);
                                        goto LAB_01d88354;
                                      }
                                    }
                                  }
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar123 = ZEXT1664(auVar39);
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar124 = ZEXT1664(auVar39);
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar125 = ZEXT1664(auVar39);
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar126 = ZEXT1664(auVar39);
                                  auVar39 = vxorps_avx512vl(auVar60,auVar60);
                                  auVar127 = ZEXT1664(auVar39);
                                  auVar39 = vmovdqa64_avx512vl(local_3940);
                                  auVar111 = ZEXT1664(auVar39);
                                  auVar39 = vmovdqa64_avx512vl(local_3950);
                                  auVar128 = ZEXT1664(auVar39);
                                }
                              }
                            }
LAB_01d88354:
                            uVar29 = uVar29 + 1;
                            pfVar35 = pfVar35 + 0x10;
                          } while (bVar27 != 0);
                          bVar27 = 0;
LAB_01d88e2d:
                          bVar31 = bVar31 & bVar27;
                          bVar36 = bVar31 == 0;
                          uVar26 = local_38c8;
                          uVar29 = local_38f8;
                          lVar25 = local_38d0;
                        }
                      } while ((!bVar36) && (uVar26 = uVar26 - 1 & uVar26, uVar26 != 0));
                    }
                    lVar25 = local_3788 + 1;
                  }
                  bVar31 = (byte)local_39ec | ~bVar31 & 0xf;
                  local_39ec = (uint)bVar31;
                  if (bVar31 == 0xf) {
                    local_39ec._0_1_ = 0xf;
                    goto LAB_01d88faf;
                  }
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar36 = (bool)(bVar31 >> 1 & 1);
                  bVar6 = (bool)(bVar31 >> 2 & 1);
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  local_3610._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * local_3610._4_4_
                  ;
                  local_3610._0_4_ =
                       (uint)(bVar31 & 1) * auVar39._0_4_ |
                       (uint)!(bool)(bVar31 & 1) * local_3610._0_4_;
                  local_3610._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * local_3610._8_4_;
                  local_3610._12_4_ =
                       (uint)bVar7 * auVar39._12_4_ | (uint)!bVar7 * local_3610._12_4_;
                }
                goto LAB_01d87b20;
              }
              auVar39 = auVar125._0_16_;
              for (lVar25 = 0;
                  (auVar111 = ZEXT1664(auVar39), lVar25 != 8 &&
                  (uVar26 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar25 * 8), uVar26 != 8));
                  lVar25 = lVar25 + 1) {
                auVar59._4_4_ = fStack_367c;
                auVar59._0_4_ = local_3680;
                auVar59._8_4_ = fStack_3678;
                auVar59._12_4_ = fStack_3674;
                uVar34 = *(undefined4 *)(root.ptr + 0x40 + lVar25 * 4);
                auVar49._4_4_ = uVar34;
                auVar49._0_4_ = uVar34;
                auVar49._8_4_ = uVar34;
                auVar49._12_4_ = uVar34;
                auVar41 = vfmsub132ps_fma(auVar49,auVar59,local_36b0);
                uVar34 = *(undefined4 *)(root.ptr + 0x80 + lVar25 * 4);
                auVar50._4_4_ = uVar34;
                auVar50._0_4_ = uVar34;
                auVar50._8_4_ = uVar34;
                auVar50._12_4_ = uVar34;
                auVar47._4_4_ = fStack_365c;
                auVar47._0_4_ = local_3660;
                auVar47._8_4_ = fStack_3658;
                auVar47._12_4_ = fStack_3654;
                uVar34 = *(undefined4 *)(root.ptr + 0xc0 + lVar25 * 4);
                auVar51._4_4_ = uVar34;
                auVar51._0_4_ = uVar34;
                auVar51._8_4_ = uVar34;
                auVar51._12_4_ = uVar34;
                auVar60 = vfmsub132ps_fma(auVar50,local_3670,local_36a0);
                auVar42 = vfmsub132ps_fma(auVar51,auVar47,local_3690);
                uVar34 = *(undefined4 *)(root.ptr + 0x60 + lVar25 * 4);
                auVar43._4_4_ = uVar34;
                auVar43._0_4_ = uVar34;
                auVar43._8_4_ = uVar34;
                auVar43._12_4_ = uVar34;
                auVar44 = vfmsub132ps_avx512vl(local_36b0,auVar59,auVar43);
                uVar34 = *(undefined4 *)(root.ptr + 0xa0 + lVar25 * 4);
                auVar45._4_4_ = uVar34;
                auVar45._0_4_ = uVar34;
                auVar45._8_4_ = uVar34;
                auVar45._12_4_ = uVar34;
                auVar45 = vfmsub132ps_avx512vl(local_36a0,local_3670,auVar45);
                uVar34 = *(undefined4 *)(root.ptr + 0xe0 + lVar25 * 4);
                auVar46._4_4_ = uVar34;
                auVar46._0_4_ = uVar34;
                auVar46._8_4_ = uVar34;
                auVar46._12_4_ = uVar34;
                auVar46 = vfmsub132ps_avx512vl(local_3690,auVar47,auVar46);
                auVar43 = vpminsd_avx(auVar41,auVar44);
                auVar40 = vpminsd_avx(auVar60,auVar45);
                auVar43 = vpmaxsd_avx(auVar43,auVar40);
                auVar40 = vpminsd_avx(auVar42,auVar46);
                auVar43 = vpmaxsd_avx(auVar43,auVar40);
                auVar40 = vpmaxsd_avx(auVar41,auVar44);
                auVar41 = vpmaxsd_avx(auVar60,auVar45);
                auVar41 = vpminsd_avx(auVar40,auVar41);
                auVar40 = vpmaxsd_avx(auVar42,auVar46);
                auVar41 = vpminsd_avx(auVar41,auVar40);
                auVar40 = vpmaxsd_avx(auVar43,local_3620);
                auVar41 = vpminsd_avx(auVar41,local_3610);
                uVar38 = vpcmpd_avx512vl(auVar40,auVar41,2);
                uVar38 = uVar38 & 0xf;
                uVar21 = uVar37;
                auVar48 = auVar39;
                if ((byte)uVar38 != 0) {
                  auVar40 = vblendmps_avx512vl(auVar125._0_16_,auVar43);
                  bVar36 = (bool)((byte)uVar38 & 1);
                  auVar48._0_4_ = (uint)bVar36 * auVar40._0_4_ | (uint)!bVar36 * auVar43._0_4_;
                  bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                  auVar48._4_4_ = (uint)bVar36 * auVar40._4_4_ | (uint)!bVar36 * auVar43._4_4_;
                  bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                  auVar48._8_4_ = (uint)bVar36 * auVar40._8_4_ | (uint)!bVar36 * auVar43._8_4_;
                  bVar36 = SUB81(uVar38 >> 3,0);
                  auVar48._12_4_ = (uint)bVar36 * auVar40._12_4_ | (uint)!bVar36 * auVar43._12_4_;
                  uVar21 = uVar26;
                  if (uVar37 != 8) {
                    *puVar32 = uVar37;
                    puVar32 = puVar32 + 1;
                    *pauVar28 = auVar39;
                    pauVar28 = pauVar28 + 1;
                  }
                }
                auVar39 = auVar48;
                uVar37 = uVar21;
              }
              if (uVar37 == 8) goto LAB_01d87cce;
              uVar9 = vcmpps_avx512vl(auVar39,local_3610,9);
              root.ptr = uVar37;
            } while ((byte)uVar29 < (byte)POPCOUNT((int)uVar9));
            *puVar32 = uVar37;
            puVar32 = puVar32 + 1;
            *pauVar28 = auVar39;
            pauVar28 = pauVar28 + 1;
LAB_01d87cce:
            iVar23 = 4;
          }
          else {
            while (uVar37 != 0) {
              k = 0;
              for (uVar29 = uVar37; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar37 = uVar37 - 1 & uVar37;
              bVar36 = occluded1(local_3798,local_37a0,root,k,&local_39b1,ray,
                                 (TravRayK<4,_false> *)&local_3710.field_0,context);
              bVar31 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar36) {
                bVar31 = 0;
              }
              local_39ec = (uint)((byte)local_39ec | bVar31);
              uVar29 = local_38f8;
            }
            iVar23 = 3;
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar123 = ZEXT1664(auVar39);
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar124 = ZEXT1664(auVar39);
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar125 = ZEXT1664(auVar39);
            auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar126 = ZEXT1664(auVar39);
            auVar39 = vxorps_avx512vl(auVar127._0_16_,auVar127._0_16_);
            auVar127 = ZEXT1664(auVar39);
            auVar111 = ZEXT1664(_local_39b0);
            if ((byte)local_39ec != 0xf) {
              auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_3610._0_4_ =
                   (uint)((byte)local_39ec & 1) * auVar39._0_4_ |
                   (uint)!(bool)((byte)local_39ec & 1) * local_3610._0_4_;
              bVar36 = (bool)((byte)(local_39ec >> 1) & 1);
              local_3610._4_4_ = (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * local_3610._4_4_;
              bVar36 = (bool)((byte)(local_39ec >> 2) & 1);
              local_3610._8_4_ = (uint)bVar36 * auVar39._8_4_ | (uint)!bVar36 * local_3610._8_4_;
              bVar36 = (bool)((byte)(local_39ec >> 3) & 1);
              local_3610._12_4_ = (uint)bVar36 * auVar39._12_4_ | (uint)!bVar36 * local_3610._12_4_;
              iVar23 = 2;
            }
            if (uVar29 < (uint)POPCOUNT(uVar34)) goto LAB_01d87b68;
          }
          auVar39 = auVar124._0_16_;
          if (iVar23 == 3) {
LAB_01d88faf:
            local_39ec._0_1_ = (byte)local_39ec & (byte)local_38ec;
            bVar36 = (bool)((byte)local_39ec >> 1 & 1);
            bVar6 = (bool)((byte)local_39ec >> 2 & 1);
            bVar7 = (bool)((byte)local_39ec >> 3 & 1);
            *(uint *)local_38e8 =
                 (uint)((byte)local_39ec & 1) * auVar39._0_4_ |
                 (uint)!(bool)((byte)local_39ec & 1) * *(int *)local_38e8;
            *(uint *)(local_38e8 + 4) =
                 (uint)bVar36 * auVar39._4_4_ | (uint)!bVar36 * *(int *)(local_38e8 + 4);
            *(uint *)(local_38e8 + 8) =
                 (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * *(int *)(local_38e8 + 8);
            *(uint *)(local_38e8 + 0xc) =
                 (uint)bVar7 * auVar39._12_4_ | (uint)!bVar7 * *(int *)(local_38e8 + 0xc);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }